

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O2

void drawImage7(Array<Imf_3_2::Rgba> *px,int w,int h,int y)

{
  Rgba *pRVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float __x;
  float fVar5;
  float fVar6;
  float fVar7;
  
  uVar3 = (long)w / -2 & 0xffffffff;
  __x = (float)(h / -2 + y);
  uVar4 = 0;
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 * 8 != uVar4; uVar4 = uVar4 + 8) {
    fVar5 = (float)(int)uVar3;
    fVar6 = atan2f(fVar5,__x);
    fVar5 = SQRT(fVar5 * fVar5 + __x * __x);
    pRVar1 = px->_data;
    fVar7 = sinf(fVar5 * 0.1);
    fVar6 = fVar6 * 3.0;
    fVar7 = sinf(fVar7 * 0.3 + fVar6);
    Imath_3_2::half::operator=((half *)((long)&(pRVar1->r)._h + uVar4),fVar7 * 0.5 + 0.5);
    fVar7 = sinf(fVar5 * 0.11);
    fVar7 = sinf(fVar7 * 0.3 + fVar6);
    Imath_3_2::half::operator=((half *)((long)&(pRVar1->g)._h + uVar4),fVar7 * 0.5 + 0.5);
    fVar5 = sinf(fVar5 * 0.12);
    fVar5 = sinf(fVar5 * 0.3 + fVar6);
    Imath_3_2::half::operator=((half *)((long)&(pRVar1->b)._h + uVar4),fVar5 * 0.5 + 0.5);
    Imath_3_2::half::operator=((half *)((long)&(pRVar1->a)._h + uVar4),1.0);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  return;
}

Assistant:

void
drawImage7 (Array<Rgba>& px, int w, int h, int y)
{
    for (int x = 0; x < w; ++x)
    {
        float xc = x - w / 2;
        float yc = y - h / 2;
        float a  = atan2 (xc, yc);
        float r  = sqrt (xc * xc + yc * yc);

        Rgba& p = px[x];
        p.r     = sin (3.0f * a + 0.3f * sin (0.10f * r)) * 0.5f + 0.5f;
        p.g     = sin (3.0f * a + 0.3f * sin (0.11f * r)) * 0.5f + 0.5f;
        p.b     = sin (3.0f * a + 0.3f * sin (0.12f * r)) * 0.5f + 0.5f;
        p.a     = 1;
    }
}